

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xpath(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xpath : 32 of 40 functions ...\n");
  }
  iVar1 = test_xmlXPathCastBooleanToNumber();
  iVar2 = test_xmlXPathCastBooleanToString();
  iVar3 = test_xmlXPathCastNodeSetToBoolean();
  iVar4 = test_xmlXPathCastNodeSetToNumber();
  iVar5 = test_xmlXPathCastNodeSetToString();
  iVar6 = test_xmlXPathCastNodeToNumber();
  iVar7 = test_xmlXPathCastNodeToString();
  iVar8 = test_xmlXPathCastNumberToBoolean();
  iVar9 = test_xmlXPathCastNumberToString();
  iVar10 = test_xmlXPathCastStringToBoolean();
  iVar11 = test_xmlXPathCastStringToNumber();
  iVar12 = test_xmlXPathCastToBoolean();
  iVar13 = test_xmlXPathCastToNumber();
  iVar14 = test_xmlXPathCastToString();
  iVar15 = test_xmlXPathCmpNodes();
  iVar16 = test_xmlXPathCompile();
  iVar17 = test_xmlXPathCompiledEval();
  iVar18 = test_xmlXPathCompiledEvalToBoolean();
  iVar19 = test_xmlXPathContextSetCache();
  iVar20 = test_xmlXPathConvertBoolean();
  iVar21 = test_xmlXPathConvertNumber();
  iVar22 = test_xmlXPathConvertString();
  iVar23 = test_xmlXPathCtxtCompile();
  iVar24 = test_xmlXPathEval();
  iVar25 = test_xmlXPathEvalExpression();
  iVar26 = test_xmlXPathEvalPredicate();
  iVar27 = test_xmlXPathInit();
  iVar28 = test_xmlXPathIsInf();
  iVar29 = test_xmlXPathIsNaN();
  iVar30 = test_xmlXPathNewContext();
  iVar31 = test_xmlXPathNodeEval();
  iVar32 = test_xmlXPathNodeSetCreate();
  iVar33 = test_xmlXPathObjectCopy();
  iVar34 = test_xmlXPathOrderDocElems();
  iVar35 = test_xmlXPathSetContextNode();
  uVar36 = iVar35 + iVar34 + iVar33 + iVar32 + iVar31 + iVar30 + iVar29 + iVar28 + iVar27 + iVar26 +
                                                                                            iVar25 +
                                                                                            iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar36 != 0) {
    printf("Module xpath: %d errors\n",(ulong)uVar36);
  }
  return uVar36;
}

Assistant:

static int
test_xpath(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpath : 32 of 40 functions ...\n");
    test_ret += test_xmlXPathCastBooleanToNumber();
    test_ret += test_xmlXPathCastBooleanToString();
    test_ret += test_xmlXPathCastNodeSetToBoolean();
    test_ret += test_xmlXPathCastNodeSetToNumber();
    test_ret += test_xmlXPathCastNodeSetToString();
    test_ret += test_xmlXPathCastNodeToNumber();
    test_ret += test_xmlXPathCastNodeToString();
    test_ret += test_xmlXPathCastNumberToBoolean();
    test_ret += test_xmlXPathCastNumberToString();
    test_ret += test_xmlXPathCastStringToBoolean();
    test_ret += test_xmlXPathCastStringToNumber();
    test_ret += test_xmlXPathCastToBoolean();
    test_ret += test_xmlXPathCastToNumber();
    test_ret += test_xmlXPathCastToString();
    test_ret += test_xmlXPathCmpNodes();
    test_ret += test_xmlXPathCompile();
    test_ret += test_xmlXPathCompiledEval();
    test_ret += test_xmlXPathCompiledEvalToBoolean();
    test_ret += test_xmlXPathContextSetCache();
    test_ret += test_xmlXPathConvertBoolean();
    test_ret += test_xmlXPathConvertNumber();
    test_ret += test_xmlXPathConvertString();
    test_ret += test_xmlXPathCtxtCompile();
    test_ret += test_xmlXPathEval();
    test_ret += test_xmlXPathEvalExpression();
    test_ret += test_xmlXPathEvalPredicate();
    test_ret += test_xmlXPathInit();
    test_ret += test_xmlXPathIsInf();
    test_ret += test_xmlXPathIsNaN();
    test_ret += test_xmlXPathNewContext();
    test_ret += test_xmlXPathNodeEval();
    test_ret += test_xmlXPathNodeSetCreate();
    test_ret += test_xmlXPathObjectCopy();
    test_ret += test_xmlXPathOrderDocElems();
    test_ret += test_xmlXPathSetContextNode();

    if (test_ret != 0)
	printf("Module xpath: %d errors\n", test_ret);
    return(test_ret);
}